

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTestFile.cpp
# Opt level: O2

bool Imf_3_4::isOpenExrFile(IStream *is,bool *tiled,bool *deep,bool *multiPart)

{
  int iVar1;
  undefined4 extraout_var;
  int local_40;
  uint local_3c;
  bool *local_38;
  
  local_38 = tiled;
  iVar1 = (*is->_vptr_IStream[5])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    (*is->_vptr_IStream[6])(is,0);
  }
  (*is->_vptr_IStream[3])(is,&local_40,4);
  (*is->_vptr_IStream[3])(is,&local_3c,4);
  (*is->_vptr_IStream[6])(is,CONCAT44(extraout_var,iVar1));
  *local_38 = (bool)((byte)(local_3c >> 9) & 1);
  *deep = (bool)((byte)(local_3c >> 0xb) & 1);
  *multiPart = (bool)((byte)(local_3c >> 0xc) & 1);
  return local_40 == 0x1312f76;
}

Assistant:

bool
isOpenExrFile (IStream& is, bool& tiled, bool& deep, bool& multiPart)
{
    try
    {
        uint64_t pos = is.tellg ();

        if (pos != 0) is.seekg (0);

        int magic, version;
        Xdr::read<StreamIO> (is, magic);
        Xdr::read<StreamIO> (is, version);

        is.seekg (pos);

        tiled     = isTiled (version);
        deep      = isNonImage (version);
        multiPart = isMultiPart (version);
        return magic == MAGIC;
    }
    catch (...)
    {
        is.clear ();
        tiled = false;
        return false;
    }
}